

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  u8 *puVar4;
  int iVar5;
  u32 uVar6;
  ulong uVar7;
  int local_40;
  int local_3c;
  MemPage *pPage;
  
  if (pBt->nPage < pgno) {
    sqlite3CorruptError(0xde4a);
    iVar5 = 0xb;
  }
  else {
    iVar5 = getAndInitPage(pBt,pgno,&pPage,0);
    if (iVar5 == 0) {
      uVar7 = 0;
      local_3c = freePageFlag;
      do {
        if (pPage->nCell <= uVar7) {
          local_40 = 0;
          if (pPage->leaf == '\0') {
            uVar6 = sqlite3Get4byte(pPage->aData + 8);
            iVar5 = clearDatabasePage(pBt,uVar6,1,pnChange);
            local_40 = iVar5;
            if (iVar5 != 0) break;
          }
          else if (pnChange != (int *)0x0) {
            *pnChange = *pnChange + (uint)pPage->nCell;
          }
          if (local_3c == 0) {
            iVar5 = sqlite3PagerWrite(pPage->pDbPage);
            if (iVar5 == 0) {
              zeroPage(pPage,*pPage->aData | 8);
              iVar5 = 0;
            }
          }
          else {
            freePage(pPage,&local_40);
            iVar5 = local_40;
          }
          break;
        }
        uVar3 = pPage->maskPage;
        uVar1 = pPage->aCellIdx[uVar7 * 2];
        uVar2 = pPage->aCellIdx[uVar7 * 2 + 1];
        puVar4 = pPage->aData;
        if (pPage->leaf == '\0') {
          uVar6 = sqlite3Get4byte(puVar4 + (CONCAT11(uVar1,uVar2) & uVar3));
          iVar5 = clearDatabasePage(pBt,uVar6,1,pnChange);
          if (iVar5 != 0) break;
        }
        iVar5 = clearCell(pPage,puVar4 + (CONCAT11(uVar1,uVar2) & uVar3));
        uVar7 = uVar7 + 1;
      } while (iVar5 == 0);
      releasePage(pPage);
    }
  }
  return iVar5;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }

  rc = getAndInitPage(pBt, pgno, &pPage, 0);
  if( rc ) return rc;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[0] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}